

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O3

void google::protobuf::compiler::MockCodeGenerator::ExpectGenerated
               (string_view name,string_view parameter,string_view insertions,string_view file,
               string_view first_message_name,string_view first_parsed_file_name,
               string_view output_directory)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Nonnull<const_char_*> failure_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  AssertHelperData *c;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  string content;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_1d8 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [2];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1a0;
  pointer local_198;
  undefined1 local_178 [16];
  undefined1 local_168 [40];
  undefined1 local_140 [24];
  undefined1 local_128 [16];
  pointer local_118;
  AlphaNum local_f8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Status local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  AssertHelperData *local_88;
  string local_80;
  string local_50;
  
  pcVar6 = insertions._M_str;
  c = (AssertHelperData *)insertions._M_len;
  pcVar5 = name._M_str;
  local_168._32_8_ = local_140 + 8;
  local_140._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_140[8] = '\0';
  local_80._M_dataplus._M_p = (pointer)output_directory._M_len;
  local_80._M_string_length = (size_type)output_directory._M_str;
  local_f8.piece_._M_len = 1;
  local_f8.piece_._M_str = "/";
  local_1d8 = (undefined1  [8])file._M_len;
  _Stack_1d0._M_head_impl = (LogMessageData *)file._M_str;
  local_1a8 = (undefined1  [8])0x13;
  paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x3aec0a;
  pcVar7 = pcVar6;
  local_178._0_8_ = (MockCodeGenerator *)name._M_len;
  local_178._8_8_ = pcVar5;
  local_88 = c;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_50,(lts_20250127 *)local_1d8,(AlphaNum *)local_1a8,(AlphaNum *)local_178,
             (AlphaNum *)c);
  local_128._0_8_ = local_50._M_string_length;
  local_128._8_8_ = local_50._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_c8,(lts_20250127 *)&local_80,&local_f8,(AlphaNum *)local_128,
             (AlphaNum *)c);
  local_90 = parameter._M_str;
  File::ReadFileToString((File *)&local_a8,(string *)local_c8,(string *)(local_168 + 0x20),false);
  local_98 = pcVar5;
  if ((StatusRep *)local_a8.rep_ == (StatusRep *)0x1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            (&local_a8,
                             "File::GetContents( absl::StrCat(output_directory, \"/\", GetOutputFileName(name, file)), &content, true) is OK"
                            );
    if ((local_a8.rep_ & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_a8.rep_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
  }
  local_a0 = pcVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((StatusRep *)local_a8.rep_ != (StatusRep *)0x1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x7c,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_1d8);
  }
  local_1d8 = (undefined1  [8])local_140._0_8_;
  _Stack_1d0._M_head_impl = (LogMessageData *)local_168._32_8_;
  local_1c8[0]._0_1_ = 10;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8,
               (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)local_1a8,
               (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_1d8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_f8.piece_._M_len;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_f8.piece_._M_len;
  if ((char *)local_f8.piece_._M_len != local_f8.piece_._M_str) {
    do {
      if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)local_f8.piece_._M_str + -0x20))->_M_string_length != 0) break;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_f8.piece_._M_str + -0x20);
      pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_f8.piece_._M_str + -0x20))->_M_dataplus)._M_p;
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_f8.piece_._M_str + -0x20);
      local_f8.piece_._M_str = (char *)pbVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2->field_2) {
        operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8.piece_._M_len;
      }
    } while (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f8.piece_._M_str);
    pbVar4 = pbVar3;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8.piece_._M_str
        != pbVar3) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        local_1d8 = (undefined1  [8])0x1;
        _Stack_1d0._M_head_impl =
             (LogMessageData *)
             ((long)"Manifest-Version: 1.0\nCreated-By: 1.6.0 (protoc)\n\n" + 0x31);
        absl::lts_20250127::StrAppend
                  ((Nonnull<std::string_*>)((long)&(pbVar4->_M_dataplus)._M_p + lVar8),
                   (AlphaNum *)local_1d8);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8.piece_._M_str;
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8.piece_._M_len;
      } while (uVar9 < (ulong)((long)((long)local_f8.piece_._M_str - local_f8.piece_._M_len) >> 5));
    }
  }
  local_128._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_128._8_8_ =
       (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        )0x0;
  local_118 = (pointer)0x0;
  if (local_88 == (AssertHelperData *)0x0) {
    local_178._0_8_ = (AssertHelperData *)0x3;
  }
  else {
    local_178._0_8_ = local_88;
    local_178._8_8_ = local_a0;
    local_168[0] = ',';
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a8,
                 (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_1d8,
                 (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_178);
    local_1c8[0]._0_8_ = local_118;
    _Stack_1d0._M_head_impl = (LogMessageData *)local_128._8_8_;
    local_1d8 = (undefined1  [8])local_128._0_8_;
    local_118 = local_198;
    local_128._0_8_ = local_1a8;
    local_128._8_8_ = paStack_1a0;
    local_1a8 = (undefined1  [8])0x0;
    paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_198 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
    local_178._0_8_ = ((long)(local_128._8_8_ - local_128._0_8_) >> 4) + 3;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_f8.piece_._M_str;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_f8.piece_._M_len;
  }
  local_1a8 = (undefined1  [8])((long)pbVar3 - (long)pbVar4 >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1d8,"lines.size()","3 + insertion_list.size() * 2",
             (unsigned_long *)local_1a8,(unsigned_long *)local_178);
  if (local_1d8[0] == (lts_20250127)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_1d0._M_head_impl ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(_Stack_1d0._M_head_impl)->entry)->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if (local_1a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1a8 + 8))();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_1d0._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1d0._M_head_impl);
  }
  generator_name._M_str = (char *)parameter._M_len;
  generator_name._M_len = (size_t)local_98;
  parameter_00._M_str = pcVar7;
  parameter_00._M_len = (size_t)local_90;
  GetOutputFileContent_abi_cxx11_
            ((string *)local_1d8,(MockCodeGenerator *)name._M_len,generator_name,parameter_00,file,
             first_parsed_file_name,first_message_name);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_1a8,
             "GetOutputFileContent(name, parameter, file, first_parsed_file_name, first_message_name)"
             ,"lines[0]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_f8.piece_._M_len);
  if (local_1d8 != (undefined1  [8])local_1c8) {
    operator_delete((void *)local_1d8,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
  }
  if (local_1a8[0] ==
      (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       )0x0) {
    testing::Message::Message((Message *)local_1d8);
    if (paStack_1a0 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)paStack_1a0->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x90,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if (local_1d8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_1d8 + 8))();
    }
  }
  if (paStack_1a0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&paStack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_1a0);
  }
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            ((internal *)local_1d8,"kFirstInsertionPoint","lines[1 + insertion_list.size()]",
             (basic_string_view<char,_std::char_traits<char>_> *)
             compiler::(anonymous_namespace)::kFirstInsertionPoint,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((char *)(local_128._8_8_ + (0x20 - local_128._0_8_)) +
             (long)(_Alloc_hider *)local_f8.piece_._M_len));
  if (local_1d8[0] == (lts_20250127)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_1d0._M_head_impl ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(_Stack_1d0._M_head_impl)->entry)->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x92,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if (local_1a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1a8 + 8))();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_1d0._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1d0._M_head_impl);
  }
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            ((internal *)local_1d8,"kSecondInsertionPoint","lines[2 + insertion_list.size() * 2]",
             (basic_string_view<char,_std::char_traits<char>_> *)
             compiler::(anonymous_namespace)::kSecondInsertionPoint,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_f8.piece_._M_len + (local_128._8_8_ - local_128._0_8_) * 2 + 0x40));
  if (local_1d8[0] == (lts_20250127)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )_Stack_1d0._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)_Stack_1d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x93,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1a8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1a8 + 8))();
    }
  }
  if (_Stack_1d0._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1d0._M_head_impl);
  }
  if (local_128._8_8_ != local_128._0_8_) {
    lVar8 = 0x20;
    uVar9 = 0;
    do {
      generator_name_00._M_str = (char *)0xc;
      generator_name_00._M_len = *(size_t *)(local_128._0_8_ + lVar8 + -0x20);
      parameter_01._M_str = pcVar7;
      parameter_01._M_len = (size_t)"first_insert";
      GetOutputFileContent_abi_cxx11_
                ((string *)local_1d8,*(MockCodeGenerator **)(local_128._0_8_ + lVar8 + -0x18),
                 generator_name_00,parameter_01,file,file,first_message_name);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)local_1a8,
                 "GetOutputFileContent(insertion_list[i], \"first_insert\", file, file, first_message_name)"
                 ,"lines[1 + i]",(string *)local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((_Alloc_hider *)local_f8.piece_._M_len)->_M_p + lVar8));
      if (local_1d8 != (undefined1  [8])local_1c8) {
        operator_delete((void *)local_1d8,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
      }
      if (local_1a8[0] ==
          (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           )0x0) {
        testing::Message::Message((Message *)local_1d8);
        pcVar5 = "";
        if (paStack_1a0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar5 = (char *)paStack_1a0->_M_allocated_capacity;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x98,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
        if (local_1d8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1d8 + 8))();
        }
      }
      if (paStack_1a0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&paStack_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     paStack_1a0);
      }
      local_1d8 = (undefined1  [8])0x2;
      _Stack_1d0._M_head_impl = (LogMessageData *)((long)"\n  " + 1);
      generator_name_01._M_str = (char *)0xd;
      generator_name_01._M_len = *(size_t *)(local_128._0_8_ + lVar8 + -0x20);
      parameter_02._M_str = pcVar7;
      parameter_02._M_len = (size_t)"second_insert";
      GetOutputFileContent_abi_cxx11_
                (&local_80,*(MockCodeGenerator **)(local_128._0_8_ + lVar8 + -0x18),
                 generator_name_01,parameter_02,file,file,first_message_name);
      local_1a8 = (undefined1  [8])local_80._M_string_length;
      paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_178,(lts_20250127 *)local_1d8,(AlphaNum *)local_1a8,
                 (AlphaNum *)local_80._M_string_length);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)local_c8,
                 "absl::StrCat( \"  \", GetOutputFileContent(insertion_list[i], \"second_insert\", file, file, first_message_name))"
                 ,"lines[2 + insertion_list.size() + i]",(string *)local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((char *)(local_128._8_8_ + (lVar8 - local_128._0_8_) + 0x20) +
                 (long)(_Alloc_hider *)local_f8.piece_._M_len));
      if ((AssertHelperData *)local_178._0_8_ != (AssertHelperData *)local_168) {
        operator_delete((void *)local_178._0_8_,CONCAT71(local_168._1_7_,local_168[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_c8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1d8);
        pcVar5 = "";
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_c0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x9e,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
        if (local_1d8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1d8 + 8))();
        }
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)((long)(local_128._8_8_ - local_128._0_8_) >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._32_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_140 + 8)) {
    operator_delete((void *)local_168._32_8_,CONCAT71(local_140._9_7_,local_140[8]) + 1);
  }
  return;
}

Assistant:

void MockCodeGenerator::ExpectGenerated(
    absl::string_view name, absl::string_view parameter,
    absl::string_view insertions, absl::string_view file,
    absl::string_view first_message_name,
    absl::string_view first_parsed_file_name,
    absl::string_view output_directory) {
  std::string content;
  ABSL_CHECK_OK(File::GetContents(
      absl::StrCat(output_directory, "/", GetOutputFileName(name, file)),
      &content, true));

  std::vector<std::string> lines =
      absl::StrSplit(content, '\n', absl::SkipEmpty());

  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  for (size_t i = 0; i < lines.size(); i++) {
    absl::StrAppend(&lines[i], "\n");
  }

  std::vector<std::string> insertion_list;
  if (!insertions.empty()) {
    insertion_list = absl::StrSplit(insertions, ',', absl::SkipEmpty());
  }

  EXPECT_EQ(lines.size(), 3 + insertion_list.size() * 2);
  EXPECT_EQ(GetOutputFileContent(name, parameter, file, first_parsed_file_name,
                                 first_message_name),
            lines[0]);

  EXPECT_EQ(kFirstInsertionPoint, lines[1 + insertion_list.size()]);
  EXPECT_EQ(kSecondInsertionPoint, lines[2 + insertion_list.size() * 2]);

  for (size_t i = 0; i < insertion_list.size(); i++) {
    EXPECT_EQ(GetOutputFileContent(insertion_list[i], "first_insert", file,
                                   file, first_message_name),
              lines[1 + i]);
    // Second insertion point is indented, so the inserted text should
    // automatically be indented too.
    EXPECT_EQ(absl::StrCat(
                  "  ", GetOutputFileContent(insertion_list[i], "second_insert",
                                             file, file, first_message_name)),
              lines[2 + insertion_list.size() + i]);
  }
}